

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O1

bool __thiscall AMovingCamera::Interpolate(AMovingCamera *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  AActor *pAVar5;
  double dVar6;
  double dVar7;
  
  pAVar5 = (this->super_APathFollower).super_AActor.tracer.field_0.p;
  if (pAVar5 != (AActor *)0x0) {
    if (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      bVar4 = APathFollower::Interpolate(&this->super_APathFollower);
      if (bVar4) {
        pAVar5 = (this->super_APathFollower).super_AActor.tracer.field_0.p;
        dVar6 = c_atan2((pAVar5->__Pos).Y - (this->super_APathFollower).super_AActor.__Pos.Y,
                        (pAVar5->__Pos).X - (this->super_APathFollower).super_AActor.__Pos.X);
        (this->super_APathFollower).super_AActor.Angles.Yaw.Degrees = dVar6 * 57.29577951308232;
        bVar4 = true;
        if (((this->super_APathFollower).super_AActor.args[2] & 4) != 0) {
          dVar6 = (this->super_APathFollower).super_AActor.__Pos.X;
          dVar7 = (this->super_APathFollower).super_AActor.__Pos.Y;
          pAVar5 = (this->super_APathFollower).super_AActor.tracer.field_0.p;
          if ((pAVar5 != (AActor *)0x0) &&
             (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
            (this->super_APathFollower).super_AActor.tracer.field_0.p = (AActor *)0x0;
            pAVar5 = (AActor *)0x0;
          }
          dVar1 = (this->super_APathFollower).super_AActor.__Pos.Z;
          dVar2 = ((this->super_APathFollower).super_AActor.tracer.field_0.p)->Height;
          dVar6 = dVar6 - (pAVar5->__Pos).X;
          dVar7 = dVar7 - (pAVar5->__Pos).Y;
          dVar3 = (pAVar5->__Pos).Z;
          dVar6 = c_sqrt(dVar7 * dVar7 + dVar6 * dVar6);
          dVar7 = 0.0;
          if ((dVar6 != 0.0) || (NAN(dVar6))) {
            dVar7 = c_atan2(dVar1 - (dVar2 * 0.5 + dVar3),dVar6);
            dVar7 = dVar7 * 57.29577951308232;
          }
          (this->super_APathFollower).super_AActor.Angles.Pitch.Degrees = dVar7;
        }
      }
      else {
        bVar4 = false;
      }
      return bVar4;
    }
    (this->super_APathFollower).super_AActor.tracer.field_0.p = (AActor *)0x0;
  }
  bVar4 = APathFollower::Interpolate(&this->super_APathFollower);
  return bVar4;
}

Assistant:

bool AMovingCamera::Interpolate ()
{
	if (tracer == NULL)
		return Super::Interpolate ();

	if (Super::Interpolate ())
	{
		Angles.Yaw = AngleTo(tracer, true);

		if (args[2] & 4)
		{ // Also aim camera's pitch;
			DVector3 diff = Pos() - tracer->PosPlusZ(tracer->Height / 2);
			double dist = diff.XY().Length();
			Angles.Pitch = dist != 0.f ? VecToAngle(dist, diff.Z) : 0.;
		}

		return true;
	}
	return false;
}